

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O2

bool tinyusdz::anon_unknown_160::IsUSDFileFormat(string *name)

{
  int iVar1;
  bool bVar2;
  string ext;
  string sStack_28;
  
  GetExtension(&sStack_28,name);
  iVar1 = ::std::__cxx11::string::compare((char *)&sStack_28);
  bVar2 = true;
  if (iVar1 != 0) {
    iVar1 = ::std::__cxx11::string::compare((char *)&sStack_28);
    if (iVar1 != 0) {
      iVar1 = ::std::__cxx11::string::compare((char *)&sStack_28);
      bVar2 = iVar1 == 0;
    }
  }
  ::std::__cxx11::string::_M_dispose();
  return bVar2;
}

Assistant:

bool IsUSDFileFormat(const std::string &name) {
  std::string ext = GetExtension(name);

  // no 'usdz'
  return (ext.compare("usd") == 0) || (ext.compare("usda") == 0) ||
         (ext.compare("usdc") == 0);
}